

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall soplex::SPxLPBase<double>::doRemoveRows(SPxLPBase<double> *this,int *perm)

{
  int iVar1;
  SVectorBase<double> *this_00;
  int *piVar2;
  int extraout_EDX;
  int __c;
  int __c_00;
  int extraout_EDX_00;
  int extraout_EDX_01;
  char *in_RSI;
  SPxLPBase<double> *in_RDI;
  int idx;
  int k;
  SVectorBase<double> *vec;
  int i;
  int j;
  int in_stack_ffffffffffffffcc;
  uint local_24;
  int local_18;
  
  iVar1 = nCols((SPxLPBase<double> *)0x229bbd);
  LPRowSetBase<double>::remove(&in_RDI->super_LPRowSetBase<double>,in_RSI);
  for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
    this_00 = colVector_w(in_RDI,in_stack_ffffffffffffffcc);
    local_24 = SVectorBase<double>::size(this_00);
    __c = extraout_EDX;
    while (local_24 = local_24 - 1, -1 < (int)local_24) {
      piVar2 = (int *)SVectorBase<double>::index(this_00,(char *)(ulong)local_24,__c);
      if (*(int *)(in_RSI + (long)*piVar2 * 4) < 0) {
        SVectorBase<double>::remove(this_00,(char *)(ulong)local_24);
        __c = extraout_EDX_00;
      }
      else {
        in_stack_ffffffffffffffcc = *(int *)(in_RSI + (long)*piVar2 * 4);
        piVar2 = (int *)SVectorBase<double>::index(this_00,(char *)(ulong)local_24,__c_00);
        *piVar2 = in_stack_ffffffffffffffcc;
        __c = extraout_EDX_01;
      }
    }
  }
  return;
}

Assistant:

virtual void doRemoveRows(int perm[])
   {
      int j = nCols();

      LPRowSetBase<R>::remove(perm);

      for(int i = 0; i < j; ++i)
      {
         SVectorBase<R>& vec = colVector_w(i);

         for(int k = vec.size() - 1; k >= 0; --k)
         {
            int idx = vec.index(k);

            if(perm[idx] < 0)
               vec.remove(k);
            else
               vec.index(k) = perm[idx];
         }
      }
   }